

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O1

void server_ping_all(void *server_void)

{
  EOClient *this;
  int iVar1;
  uint uVar2;
  long *plVar3;
  PacketBuilder builder;
  size_t throwaway;
  PacketBuilder PStack_68;
  _Type local_38 [2];
  
  plVar3 = *(long **)((long)server_void + 0x38);
  if (plVar3 != (long *)((long)server_void + 0x38)) {
    do {
      this = (EOClient *)plVar3[2];
      if (this->needpong == true) {
        Client::Close((Client *)this,false);
      }
      else {
        iVar1 = util::rand();
        this->upcoming_seq_start = iVar1;
        uVar2 = util::rand();
        iVar1 = this->upcoming_seq_start;
        PacketBuilder::PacketBuilder(&PStack_68,PACKET_CONNECTION,PACKET_PLAYER,3);
        local_38[0] = (_Type)PacketProcessor::ENumber(uVar2 & 0xffff,(size_t *)local_38);
        std::__cxx11::string::append((char *)&PStack_68.data,(ulong)local_38);
        PacketProcessor::ENumber(uVar2 - iVar1 & 0xff,(size_t *)local_38);
        std::__cxx11::string::push_back((char)&PStack_68 + '\b');
        this->needpong = true;
        EOClient::Send(this,&PStack_68);
        if (PStack_68.data._M_string_length != 0) {
          memset(PStack_68.data._M_dataplus._M_p,0,PStack_68.data._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)PStack_68.data._M_dataplus._M_p != &PStack_68.data.field_2) {
          operator_delete(PStack_68.data._M_dataplus._M_p,
                          PStack_68.data.field_2._M_allocated_capacity + 1);
        }
      }
      plVar3 = (long *)*plVar3;
    } while (plVar3 != (long *)((long)server_void + 0x38));
  }
  return;
}

Assistant:

void server_ping_all(void *server_void)
{
	EOServer *server = static_cast<EOServer *>(server_void);

	UTIL_FOREACH(server->clients, rawclient)
	{
		EOClient *client = static_cast<EOClient *>(rawclient);

		if (client->needpong)
		{
			client->Close();
		}
		else
		{
			client->PingNewSequence();
			auto seq_bytes = client->GetSeqUpdateBytes();

			PacketBuilder builder(PACKET_CONNECTION, PACKET_PLAYER, 3);
			builder.AddShort(seq_bytes.first);
			builder.AddChar(seq_bytes.second);

			client->needpong = true;
			client->Send(builder);
		}
	}
}